

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTree.cpp
# Opt level: O0

void __thiscall DTree::extendDTree(DTree *this,DTreeNode *node)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  pointer pvVar3;
  DTree *in_RSI;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> unaff_retaddr;
  const_iterator in_stack_00000008;
  int i;
  DTreeNode *child;
  _Prime_rehash_policy *this_00;
  value_type_conflict *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  int local_1c;
  DTreeNode *node_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  
  __last._M_current = (int *)in_RDI;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(*(int *)&(in_RSI->_nodes).
                                 super__Vector_base<DTreeNode_*,_std::allocator<DTreeNode_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = (pointer)operator_new__(uVar2);
  in_RSI[1]._attr.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar3;
  node_00 = (DTreeNode *)(in_RSI->_nodesMap)._M_h._M_buckets;
  for (local_1c = 0;
      local_1c <
      *(int *)&(in_RSI->_nodes).super__Vector_base<DTreeNode_*,_std::allocator<DTreeNode_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage; local_1c = local_1c + 1) {
    extendDTree(in_RSI,node_00);
    this_00 = &(in_RSI->_nodesMap)._M_h._M_rehash_policy;
    std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this_00);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,_std::allocator<int>_> *)in_RSI,in_stack_00000008,unaff_retaddr,__last);
    *(int *)((long)&((in_RSI[1]._attr.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start + (long)local_1c * 4) = node_00->_id;
    node_00 = node_00->_next;
  }
  return;
}

Assistant:

void DTree::extendDTree(DTreeNode* node)
{
	node->_schema.push_back(node->_id);
	node->_childrenIDs = new int[node->_numOfChildren + 1];

	/* Copy the schema from all children up. */
	DTreeNode* child = node->_firstChild;
	for (int i = 0; i < node->_numOfChildren; ++i)
	{
		extendDTree(child);
		node->_schema.insert(node->_schema.end(), child->_schema.begin(),
				child->_schema.end());
		node->_childrenIDs[i] = child->_id;
		child = child->_next;
	}
}